

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

Vec_Vec_t * Gia_ManLevelize(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Vec_t *p_00;
  void **ppvVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  Gia_Obj_t *pObj;
  long lVar9;
  
  uVar2 = Gia_ManLevelNum(p);
  uVar1 = uVar2 + 1;
  p_00 = (Vec_Vec_t *)malloc(0x10);
  uVar3 = 8;
  if (6 < uVar2) {
    uVar3 = uVar1;
  }
  p_00->nCap = uVar3;
  if (uVar3 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)(int)uVar3 << 3);
  }
  p_00->pArray = ppvVar5;
  if (-1 < (int)uVar2) {
    uVar7 = 0;
    do {
      pvVar6 = calloc(1,0x10);
      ppvVar5[uVar7] = pvVar6;
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  p_00->nSize = uVar1;
  iVar4 = p->nObjs;
  if (0 < iVar4) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      pObj = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar9);
      if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
        iVar4 = Gia_ObjLevel(p,pObj);
        if ((int)uVar2 < iVar4) {
          __assert_fail("Level <= nLevels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                        ,0x19d,"Vec_Vec_t *Gia_ManLevelize(Gia_Man_t *)");
        }
        Vec_VecPush(p_00,iVar4,pObj);
        iVar4 = p->nObjs;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar8 < iVar4);
  }
  return p_00;
}

Assistant:

Vec_Vec_t * Gia_ManLevelize( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, Level, i;
    nLevels = Gia_ManLevelNum( p );
    vLevels = Vec_VecStart( nLevels + 1 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Level = Gia_ObjLevel( p, pObj );
        assert( Level <= nLevels );
        Vec_VecPush( vLevels, Level, pObj );
    }
    return vLevels;
}